

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

Scope * Scope::Intersection(Scope *__return_storage_ptr__,Scope *a,Scope *b)

{
  Index i;
  Index *pIVar1;
  bool bVar2;
  Index *pIVar3;
  
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pIVar1 = (a->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pIVar3 = (a->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start; pIVar3 != pIVar1; pIVar3 = pIVar3 + 1) {
    i = *pIVar3;
    bVar2 = Contains(b,i);
    if (bVar2) {
      Insert(__return_storage_ptr__,i);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Scope Scope::Intersection(const Scope& a, const Scope& b)
{
    Scope result;
    SDT::const_iterator it = a.SDT::begin();
    SDT::const_iterator last = a.SDT::end();
    while(it != last)
    {
        Index i = *it;
        if(b.Contains(i))
            result.Insert(i);
        it++;
    }
    return result;
}